

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O2

bool __thiscall spvtools::opt::anon_unknown_0::LoopUnswitch::CanUnswitchLoop(LoopUnswitch *this)

{
  uint **ppuVar1;
  __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> entry;
  bool bVar2;
  CFG *this_00;
  BasicBlock *this_01;
  Instruction *pIVar3;
  DefUseManager *this_02;
  Operand *pOVar4;
  uint **ppuVar5;
  DominatorTree *post_dom_tree;
  __node_base *p_Var6;
  
  bVar2 = true;
  if (this->switch_block_ == (BasicBlock *)0x0) {
    bVar2 = Loop::IsSafeToClone(this->loop_);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      this_00 = IRContext::cfg(this->context_);
      p_Var6 = &(this->loop_->loop_basic_blocks_)._M_h._M_before_begin;
      do {
        do {
          do {
            do {
              p_Var6 = p_Var6->_M_nxt;
              if (p_Var6 == (__node_base *)0x0) {
                return this->switch_block_ != (BasicBlock *)0x0;
              }
              this_01 = CFG::block(this_00,(uint32_t)*(size_type *)(p_Var6 + 1));
            } while (this->loop_->loop_latch_ == this_01);
            pIVar3 = BasicBlock::terminator(this_01);
            bVar2 = Instruction::IsBranch(pIVar3);
          } while ((!bVar2) ||
                  (pIVar3 = BasicBlock::terminator(this_01), pIVar3->opcode_ == OpBranch));
          pIVar3 = BasicBlock::terminator(this_01);
          bVar2 = Instruction::IsBranch(pIVar3);
          if (!bVar2) {
            __assert_fail("insn->IsBranch()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                          ,0x225,
                          "bool spvtools::opt::(anonymous namespace)::LoopUnswitch::IsConditionNonConstantLoopInvariant(Instruction *)"
                         );
          }
          if (pIVar3->opcode_ == OpBranch) {
            __assert_fail("insn->opcode() != spv::Op::OpBranch",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                          ,0x226,
                          "bool spvtools::opt::(anonymous namespace)::LoopUnswitch::IsConditionNonConstantLoopInvariant(Instruction *)"
                         );
          }
          this_02 = IRContext::get_def_use_mgr(this->context_);
          pOVar4 = Instruction::GetOperand(pIVar3,0);
          ppuVar1 = (uint **)(pOVar4->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar5 = &(pOVar4->words).small_data_;
          if (ppuVar1 != (uint **)0x0) {
            ppuVar5 = ppuVar1;
          }
          pIVar3 = analysis::DefUseManager::GetDef(this_02,**ppuVar5);
          bVar2 = Instruction::IsConstant(pIVar3);
        } while ((bVar2) || (bVar2 = Loop::IsInsideLoop(this->loop_,pIVar3), bVar2));
        entry._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
             (((this->function_->blocks_).
               super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t;
        post_dom_tree =
             (DominatorTree *)IRContext::GetPostDominatorAnalysis(this->context_,this->function_);
        bVar2 = IsDynamicallyUniform
                          (this,pIVar3,
                           (BasicBlock *)
                           entry._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,
                           post_dom_tree);
      } while (!bVar2);
      this->switch_block_ = this_01;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool CanUnswitchLoop() {
    if (switch_block_) return true;
    if (loop_->IsSafeToClone()) return false;

    CFG& cfg = *context_->cfg();

    for (uint32_t bb_id : loop_->GetBlocks()) {
      BasicBlock* bb = cfg.block(bb_id);
      if (loop_->GetLatchBlock() == bb) {
        continue;
      }

      if (bb->terminator()->IsBranch() &&
          bb->terminator()->opcode() != spv::Op::OpBranch) {
        if (IsConditionNonConstantLoopInvariant(bb->terminator())) {
          switch_block_ = bb;
          break;
        }
      }
    }

    return switch_block_;
  }